

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viewer.cpp
# Opt level: O0

void CS248::Viewer::drawError(void)

{
  Color color;
  Color color_00;
  Color color_01;
  undefined8 uVar1;
  int iVar2;
  unsigned_long *puVar3;
  long lVar4;
  float fVar5;
  double dVar6;
  undefined1 auVar7 [16];
  float fVar8;
  float fVar9;
  float y;
  float fVar10;
  undefined1 auVar11 [16];
  int id3;
  int id2;
  int id1;
  size_t boxY0;
  size_t boxX0;
  size_t boxWidth;
  size_t boxHeight;
  int textHeight;
  int textSize;
  Color errorColor;
  string clickPrompt;
  string errorTitle;
  undefined4 in_stack_fffffffffffffdf0;
  float fVar12;
  float fVar13;
  float fVar14;
  float x;
  float fVar15;
  float fVar16;
  float fVar17;
  float local_19c;
  int local_16c;
  Color local_160;
  string local_150 [36];
  int local_12c;
  Color local_128;
  string local_118 [36];
  int local_f4;
  Color local_f0;
  string local_e0 [36];
  int local_bc;
  ulong local_b8;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  unsigned_long local_98;
  int local_8c;
  undefined4 local_88;
  Color local_84;
  Color local_74;
  Color local_58;
  string local_40 [32];
  string local_20 [32];
  
  if ((showingError & 1) != 0) {
    printf("Showing Error! *******************\n");
    glPushAttrib(0x800);
    glViewport(0,0,(undefined4)buffer_w,(undefined4)buffer_h);
    glMatrixMode(0x1701);
    glPushMatrix();
    glLoadIdentity();
    glOrtho();
    glMatrixMode(0x1700);
    glPushMatrix();
    glLoadIdentity();
    glTranslatef();
    glDisable(0xb71);
    glDisable(0xb50);
    std::__cxx11::string::string(local_20);
    std::__cxx11::string::string(local_40);
    Color::Color(&local_58,0.0,0.0,0.0,1.0);
    if ((errorFatal & 1) == 0) {
      Color::Color(&local_84,1.0,0.65,0.2,1.0);
      local_58.r = local_84.r;
      local_58.g = local_84.g;
      local_58.b = local_84.b;
      local_58.a = local_84.a;
      std::__cxx11::string::operator=(local_20,"ERROR");
      std::__cxx11::string::operator=(local_40,"Click anywhere to dismiss.");
    }
    else {
      Color::Color(&local_74,0.85,0.3,0.3,1.0);
      local_58.r = local_74.r;
      local_58.g = local_74.g;
      local_58.b = local_74.b;
      local_58.a = local_74.a;
      std::__cxx11::string::operator=(local_20,"FATAL ERROR");
      std::__cxx11::string::operator=(local_40,"Click anywhere to exit.");
    }
    local_88 = 0x10;
    if ((HDPI & 1) == 0) {
      local_16c = 0x10;
    }
    else {
      local_16c = 0x20;
    }
    local_8c = local_16c;
    glBegin(7);
    glColor4f();
    glVertex2f();
    glVertex2f();
    glVertex2f();
    glVertex2f();
    local_98 = (unsigned_long)(local_8c * 0xb);
    local_a0 = (ulong)(CONCAT44(buffer_h._4_4_,(undefined4)buffer_h) * 2) / 3;
    puVar3 = std::min<unsigned_long>(&local_98,&local_a0);
    local_98 = *puVar3;
    local_a8 = (ulong)(CONCAT44(buffer_w._4_4_,(undefined4)buffer_w) * 2) / 3;
    local_b0 = CONCAT44(buffer_w._4_4_,(undefined4)buffer_w) / 6;
    local_b8 = CONCAT44(buffer_h._4_4_,(undefined4)buffer_h) / 6;
    glColor4f();
    local_19c = (float)(local_b0 + local_a8);
    glVertex2f();
    fVar8 = (float)(long)(local_b0 + local_a8);
    fVar15 = (float)(local_b0 + local_a8);
    fVar9 = (float)(long)(local_b8 + local_98);
    fVar16 = (float)(local_b8 + local_98);
    fVar17 = fVar15;
    glVertex2f();
    y = (float)(long)local_b0;
    fVar13 = (float)local_b0;
    fVar10 = (float)(long)(local_b8 + local_98);
    fVar14 = (float)(local_b8 + local_98);
    x = fVar13;
    glVertex2f();
    fVar12 = (float)local_b0;
    glVertex2f();
    glEnd();
    std::__cxx11::string::string(local_e0,local_20);
    Color::Color(&local_f0,1.0,1.0,1.0,1.0);
    color.g = fVar8;
    color.r = fVar16;
    color.b = fVar17;
    color.a = local_19c;
    iVar2 = OSDText::add_line((OSDText *)CONCAT44(fVar9,fVar15),x,y,
                              (string *)CONCAT44(fVar14,fVar10),CONCAT44(fVar13,fVar12),color);
    std::__cxx11::string::~string(local_e0);
    uVar1 = osd_text;
    lVar4 = local_b0 + (long)(local_8c * 2);
    auVar7._8_4_ = (int)((ulong)lVar4 >> 0x20);
    auVar7._0_8_ = lVar4;
    auVar7._12_4_ = 0x45300000;
    dVar6 = (auVar7._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0);
    auVar11._4_4_ = buffer_w._4_4_;
    auVar11._0_4_ = (undefined4)buffer_w;
    auVar11._8_4_ = buffer_w._4_4_;
    auVar11._12_4_ = 0x45300000;
    fVar5 = (float)((dVar6 + dVar6) /
                    ((auVar11._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(undefined4)buffer_w) - 4503599627370496.0)) - 1.0)
    ;
    local_bc = iVar2;
    std::__cxx11::string::string(local_118,(string *)errorMessage_abi_cxx11_);
    Color::Color(&local_128,1.0,1.0,1.0,1.0);
    color_00.g = fVar8;
    color_00.r = fVar16;
    color_00.b = fVar17;
    color_00.a = local_19c;
    iVar2 = OSDText::add_line((OSDText *)CONCAT44(fVar9,fVar15),x,y,
                              (string *)CONCAT44(fVar14,fVar10),CONCAT44(fVar13,fVar12),color_00);
    std::__cxx11::string::~string(local_118);
    local_f4 = iVar2;
    std::__cxx11::string::string(local_150,local_40);
    Color::Color(&local_160,1.0,1.0,1.0,1.0);
    color_01.g = fVar8;
    color_01.r = fVar16;
    color_01.b = fVar17;
    color_01.a = local_19c;
    iVar2 = OSDText::add_line((OSDText *)CONCAT44(fVar9,fVar15),x,y,
                              (string *)CONCAT44(fVar14,fVar10),CONCAT44(fVar13,fVar12),color_01);
    std::__cxx11::string::~string(local_150);
    local_12c = iVar2;
    OSDText::render((OSDText *)CONCAT44(fVar14,fVar10));
    iVar2 = (int)((ulong)uVar1 >> 0x20);
    OSDText::del_line((OSDText *)CONCAT44(fVar5,in_stack_fffffffffffffdf0),iVar2);
    OSDText::del_line((OSDText *)CONCAT44(fVar5,in_stack_fffffffffffffdf0),iVar2);
    OSDText::del_line((OSDText *)CONCAT44(fVar5,in_stack_fffffffffffffdf0),iVar2);
    glMatrixMode(0x1701);
    glPopMatrix();
    glMatrixMode(0x1700);
    glPopMatrix();
    glPopAttrib();
    glEnable(0xb71);
    glEnable(0xb50);
    std::__cxx11::string::~string(local_40);
    std::__cxx11::string::~string(local_20);
  }
  return;
}

Assistant:

void Viewer::drawError() {

    if( !showingError) {
        return;
    }
   
    printf("Showing Error! *******************\n");

    // GL prep
    // Note: This was copied in, I think it's a bit overkill
    glPushAttrib(GL_VIEWPORT_BIT);
    glViewport(0, 0, buffer_w, buffer_h);
    glMatrixMode(GL_PROJECTION);
    glPushMatrix();
    glLoadIdentity();
    glOrtho(0, buffer_w, buffer_h, 0, 0, 1);
    glMatrixMode(GL_MODELVIEW);
    glPushMatrix();
    glLoadIdentity();
    glTranslatef(0, 0, -1);
    glDisable(GL_DEPTH_TEST);
    glDisable(GL_LIGHTING);
    
    // Style based on error type
    std::string errorTitle;
    std::string clickPrompt;
    Color errorColor;
    if(errorFatal) {
        errorColor = Color(.85, .3, .3);
        errorTitle = "FATAL ERROR";
        clickPrompt = "Click anywhere to exit.";
    } else { 
        errorColor = Color(1.0, .65, .2);
        errorTitle = "ERROR";
        clickPrompt = "Click anywhere to dismiss.";
    }

    // == Draw the error overlay
    int textSize = 16;
    int textHeight = HDPI ? 2*textSize : textSize;
    glBegin(GL_QUADS);

    // Gray out the background
    glColor4f(.5, .5, .5, .8);
    glVertex2f(0,0);
    glVertex2f(0,buffer_h);
    glVertex2f(buffer_w, buffer_h);
    glVertex2f(buffer_w, 0);

    // Draw a scary red box
    size_t boxHeight = 11*textHeight;
    boxHeight = std::min(boxHeight, 2*buffer_h/3);
    size_t boxWidth = 2*buffer_w/3;
    size_t boxX0 = buffer_w/6;
    size_t boxY0 = buffer_h/6;
    glColor4f(errorColor.r, errorColor.g, errorColor.b, 0.8);
    glVertex2f(boxX0 + boxWidth, boxY0);
    glVertex2f(boxX0 + boxWidth, boxY0 + boxHeight);
    glVertex2f(boxX0, boxY0 + boxHeight);
    glVertex2f(boxX0, boxY0);

    glEnd();
    
    // == Draw the text
    // Note that the coordinates in each command are transformed to the [-1,1] coordinates used in OSDText.

    int id1 = osd_text->add_line(2.0*(boxX0 + 2*textHeight)/buffer_w - 1.0,
                                -2.0*(boxY0 + 3*textHeight)/buffer_h + 1.0, 
                                 errorTitle, 2*textSize, Color(1,1,1));
    int id2 = osd_text->add_line(2.0*(boxX0 + 2*textHeight)/buffer_w - 1.0,
                                -2.0*(boxY0 + 6*textHeight)/buffer_h + 1.0, 
                                 errorMessage, 2*textSize, Color(1,1,1));
    int id3 = osd_text->add_line(2.0*(boxX0 + 2*textHeight)/buffer_w - 1.0,
                                -2.0*(boxY0 + 9*textHeight)/buffer_h + 1.0, 
                                 clickPrompt, textSize, Color(1,1,1));
    
    osd_text->render();
    osd_text->del_line(id1);
    osd_text->del_line(id2);
    osd_text->del_line(id3);

    // GL cleanup
    glMatrixMode(GL_PROJECTION);
    glPopMatrix();
    glMatrixMode(GL_MODELVIEW);
    glPopMatrix();
    glPopAttrib();
    glEnable(GL_DEPTH_TEST);
    glEnable(GL_LIGHTING);
}